

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_mqtt_publish(mg_connection *nc,char *topic,uint16_t message_id,int flags,void *data,
                    size_t len)

{
  size_t sVar1;
  size_t sVar2;
  uint16_t message_id_net;
  uint16_t topic_len;
  ushort local_3c;
  ushort local_3a;
  size_t local_38;
  
  sVar1 = (nc->send_mbuf).len;
  local_38 = len;
  sVar2 = strlen(topic);
  local_3a = (ushort)sVar2 << 8 | (ushort)sVar2 >> 8;
  local_3c = message_id << 8 | message_id >> 8;
  mg_send(nc,&local_3a,2);
  sVar2 = strlen(topic);
  mg_send(nc,topic,(int)sVar2);
  if ((flags & 6U) != 0) {
    mg_send(nc,&local_3c,2);
  }
  mg_send(nc,data,(int)local_38);
  mg_mqtt_prepend_header(nc,'\x03',(uint8_t)flags,(nc->send_mbuf).len - sVar1);
  return;
}

Assistant:

void mg_mqtt_publish(struct mg_connection *nc, const char *topic,
                     uint16_t message_id, int flags, const void *data,
                     size_t len) {
    size_t old_len = nc->send_mbuf.len;

    uint16_t topic_len = htons(strlen(topic));
    uint16_t message_id_net = htons(message_id);

    mg_send(nc, &topic_len, 2);
    mg_send(nc, topic, strlen(topic));
    if (MG_MQTT_GET_QOS(flags) > 0) {
        mg_send(nc, &message_id_net, 2);
    }
    mg_send(nc, data, len);

    mg_mqtt_prepend_header(nc, MG_MQTT_CMD_PUBLISH, flags,
                           nc->send_mbuf.len - old_len);
}